

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint32 ma_dr_mp3_bs_get_bits(ma_dr_mp3_bs *bs,int n)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = bs->pos;
  bs->pos = uVar5 + n;
  uVar6 = 0;
  if ((int)(uVar5 + n) <= bs->limit) {
    uVar4 = n + (uVar5 & 7);
    uVar2 = 0xffU >> (sbyte)(uVar5 & 7) & (uint)bs->buf[(int)uVar5 >> 3];
    uVar6 = 0;
    if (8 < (int)uVar4) {
      pbVar3 = bs->buf + ((int)uVar5 >> 3);
      uVar6 = 0;
      uVar5 = uVar4;
      do {
        pbVar3 = pbVar3 + 1;
        uVar4 = uVar5 - 8;
        uVar6 = uVar6 | uVar2 << ((byte)uVar4 & 0x1f);
        uVar2 = (uint)*pbVar3;
        bVar1 = 0x10 < uVar5;
        uVar5 = uVar4;
      } while (bVar1);
    }
    uVar6 = uVar2 >> (8U - (char)uVar4 & 0x1f) | uVar6;
  }
  return uVar6;
}

Assistant:

static ma_uint32 ma_dr_mp3_bs_get_bits(ma_dr_mp3_bs *bs, int n)
{
    ma_uint32 next, cache = 0, s = bs->pos & 7;
    int shl = n + s;
    const ma_uint8 *p = bs->buf + (bs->pos >> 3);
    if ((bs->pos += n) > bs->limit)
        return 0;
    next = *p++ & (255 >> s);
    while ((shl -= 8) > 0)
    {
        cache |= next << shl;
        next = *p++;
    }
    return cache | (next >> -shl);
}